

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O3

int rsa_md_to_mgf1(X509_ALGOR **palg,EVP_MD *mgf1md)

{
  X509_ALGOR *a;
  int iVar1;
  ASN1_STRING *pAVar2;
  X509_ALGOR *alg;
  ASN1_OBJECT *aobj;
  ASN1_STRING *stmp;
  X509_ALGOR *algtmp;
  ASN1_OCTET_STRING *local_28;
  X509_ALGOR *local_20;
  
  iVar1 = EVP_MD_type((EVP_MD *)mgf1md);
  if (iVar1 - 0x2a0U < 3) {
    local_20 = (X509_ALGOR *)0x0;
    local_28 = (ASN1_STRING *)0x0;
    iVar1 = rsa_md_to_algor((X509_ALGOR **)&local_20,mgf1md);
    a = local_20;
    if (iVar1 != 0) {
      pAVar2 = ASN1_item_pack(local_20,(ASN1_ITEM *)&X509_ALGOR_it,&local_28);
      if (pAVar2 != (ASN1_STRING *)0x0) {
        alg = X509_ALGOR_new();
        *palg = (X509_ALGOR *)alg;
        if (alg != (X509_ALGOR *)0x0) {
          aobj = OBJ_nid2obj(0x38f);
          iVar1 = X509_ALGOR_set0(alg,aobj,0x10,local_28);
          if (iVar1 != 0) {
            local_28 = (ASN1_STRING *)0x0;
          }
        }
      }
    }
    ASN1_STRING_free(local_28);
    X509_ALGOR_free(a);
    return (int)(*palg != (X509_ALGOR *)0x0);
  }
  __assert_fail("is_allowed_pss_md(mgf1md)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                ,0x62,"int rsa_md_to_mgf1(X509_ALGOR **, const EVP_MD *)");
}

Assistant:

static int rsa_md_to_mgf1(X509_ALGOR **palg, const EVP_MD *mgf1md) {
  // SHA-1 should be omitted (DEFAULT), but we do not allow SHA-1.
  assert(is_allowed_pss_md(mgf1md));
  X509_ALGOR *algtmp = NULL;
  ASN1_STRING *stmp = NULL;
  // need to embed algorithm ID inside another
  if (!rsa_md_to_algor(&algtmp, mgf1md) ||
      !ASN1_item_pack(algtmp, ASN1_ITEM_rptr(X509_ALGOR), &stmp)) {
    goto err;
  }
  *palg = X509_ALGOR_new();
  if (!*palg) {
    goto err;
  }
  if (!X509_ALGOR_set0(*palg, OBJ_nid2obj(NID_mgf1), V_ASN1_SEQUENCE, stmp)) {
    goto err;
  }
  stmp = NULL;

err:
  ASN1_STRING_free(stmp);
  X509_ALGOR_free(algtmp);
  if (*palg) {
    return 1;
  }

  return 0;
}